

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O1

void master_table_dictionary_add
               (planck_unit_test_t *tc,MasterTable *master_table,Dictionary<int,_int> *dictionary,
               ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size,
               ion_dictionary_size_t dictionary_size,ion_dictionary_type_t dictionary_type)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  
  iVar1 = MasterTable::addToMasterTable<int,int>(master_table,dictionary,dictionary_size);
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar1,99,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,key_type,((dictionary->dict).instance)->key_type,0x65,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                      );
    if (pVar2 != '\0') {
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,key_size,(((dictionary->dict).instance)->record).key_size,0x66,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                        );
      if (pVar2 != '\0') {
        pVar2 = planck_unit_assert_int_are_equal
                          (tc,value_size,(((dictionary->dict).instance)->record).value_size,0x67,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                          );
        if (pVar2 != '\0') {
          pVar2 = planck_unit_assert_int_are_equal
                            (tc,dictionary_type,((dictionary->dict).instance)->type,0x68,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                            );
          if (pVar2 != '\0') {
            return;
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
master_table_dictionary_add(
	planck_unit_test_t *tc,
	MasterTable *master_table,
	Dictionary<int, int>	*dictionary,
	ion_key_type_t key_type,
	ion_key_size_t key_size,
	ion_value_size_t value_size,
	ion_dictionary_size_t dictionary_size,
	ion_dictionary_type_t dictionary_type
) {
	ion_err_t err = master_table->addToMasterTable(dictionary, dictionary_size);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_type, dictionary->dict.instance->key_type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_size, dictionary->dict.instance->record.key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, value_size, dictionary->dict.instance->record.value_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dictionary_type, dictionary->dict.instance->type);
}